

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtch(fitsfile *gfptr,int grouptype,int *status)

{
  int iVar1;
  bool bVar2;
  char local_268 [8];
  char comment [73];
  char keyvalue [71];
  char local_1c8 [8];
  char keyword [75];
  char tformBuff [54];
  char local_138 [8];
  char ttypeBuff [102];
  uchar local_c9;
  uchar charNull [1];
  char *ttype [6];
  char *tform [6];
  long tfields;
  long intNull;
  int j;
  int i;
  int grptype;
  int nrows;
  int colnum;
  int ncols;
  int uriCol;
  int locationCol;
  int positionCol;
  int extverCol;
  int extnameCol;
  int xtensionCol;
  int *status_local;
  fitsfile *pfStack_18;
  int grouptype_local;
  fitsfile *gfptr_local;
  
  nrows = 0;
  grptype = 0;
  i = 0;
  j = 0;
  tfields = 0;
  tform[5] = (char *)0x0;
  _extnameCol = status;
  status_local._4_4_ = grouptype;
  pfStack_18 = gfptr;
  memset(&local_c9,0,1);
  if (*_extnameCol == 0) {
    for (intNull._4_4_ = 0; intNull._4_4_ < 6; intNull._4_4_ = intNull._4_4_ + 1) {
      ttype[(long)intNull._4_4_ + -1] = local_138 + intNull._4_4_ * 0x11;
      ttype[(long)intNull._4_4_ + 5] = keyword + (long)(intNull._4_4_ * 9) + 0x48;
    }
    iVar1 = ffgtgc(pfStack_18,&extverCol,&positionCol,&locationCol,&uriCol,&ncols,&colnum,&j,
                   _extnameCol);
    *_extnameCol = iVar1;
    if (*_extnameCol == 0) {
      iVar1 = ffgkyj(pfStack_18,"TFIELDS",(long *)(tform + 5),local_268,_extnameCol);
      *_extnameCol = iVar1;
      iVar1 = ffgtdc(status_local._4_4_,extverCol,positionCol,locationCol,uriCol,ncols,colnum,
                     (char **)&stack0xffffffffffffff38,ttype + 5,&nrows,_extnameCol);
      *_extnameCol = iVar1;
      switch(status_local._4_4_) {
      case 0:
        break;
      case 1:
        if (uriCol != 0) {
          iVar1 = ffdcol(pfStack_18,uriCol,_extnameCol);
          *_extnameCol = iVar1;
          tform[5] = tform[5] + -1;
          if (uriCol < colnum) {
            colnum = colnum + -1;
          }
          if (uriCol < ncols) {
            ncols = ncols + -1;
          }
        }
        if (colnum != 0) {
          iVar1 = ffdcol(pfStack_18,colnum,_extnameCol);
          *_extnameCol = iVar1;
          tform[5] = tform[5] + -1;
          if (colnum < ncols) {
            ncols = ncols + -1;
          }
        }
        if (ncols != 0) {
          iVar1 = ffdcol(pfStack_18,ncols,_extnameCol);
          *_extnameCol = iVar1;
        }
        break;
      case 2:
        if (extverCol != 0) {
          iVar1 = ffdcol(pfStack_18,extverCol,_extnameCol);
          *_extnameCol = iVar1;
          tform[5] = tform[5] + -1;
          if (extverCol < positionCol) {
            positionCol = positionCol + -1;
          }
          if (extverCol < locationCol) {
            locationCol = locationCol + -1;
          }
          if (extverCol < colnum) {
            colnum = colnum + -1;
          }
          if (extverCol < ncols) {
            ncols = ncols + -1;
          }
        }
        if (positionCol != 0) {
          iVar1 = ffdcol(pfStack_18,positionCol,_extnameCol);
          *_extnameCol = iVar1;
          tform[5] = tform[5] + -1;
          if (positionCol < locationCol) {
            locationCol = locationCol + -1;
          }
          if (positionCol < colnum) {
            colnum = colnum + -1;
          }
          if (positionCol < ncols) {
            ncols = ncols + -1;
          }
        }
        if (locationCol != 0) {
          iVar1 = ffdcol(pfStack_18,locationCol,_extnameCol);
          *_extnameCol = iVar1;
          tform[5] = tform[5] + -1;
          if (locationCol < colnum) {
            colnum = colnum + -1;
          }
          if (locationCol < ncols) {
            ncols = ncols + -1;
          }
        }
        if (colnum != 0) {
          iVar1 = ffdcol(pfStack_18,colnum,_extnameCol);
          *_extnameCol = iVar1;
          tform[5] = tform[5] + -1;
          if (colnum < ncols) {
            ncols = ncols + -1;
          }
        }
        if (ncols != 0) {
          iVar1 = ffdcol(pfStack_18,ncols,_extnameCol);
          *_extnameCol = iVar1;
          tform[5] = tform[5] + -1;
        }
        break;
      case 3:
        if (colnum != 0) {
          iVar1 = ffdcol(pfStack_18,colnum,_extnameCol);
          *_extnameCol = iVar1;
          tform[5] = tform[5] + -1;
          if (colnum < ncols) {
            ncols = ncols + -1;
          }
        }
        if (ncols != 0) {
          iVar1 = ffdcol(pfStack_18,ncols,_extnameCol);
          *_extnameCol = iVar1;
          tform[5] = tform[5] + -1;
        }
        break;
      default:
        *_extnameCol = 0x15b;
        ffpmsg("Invalid value for grouptype parameter specified (ffgtch)");
        break;
      case 0xb:
        if (uriCol != 0) {
          iVar1 = ffdcol(pfStack_18,uriCol,_extnameCol);
          *_extnameCol = iVar1;
          tform[5] = tform[5] + -1;
        }
        break;
      case 0xc:
        if (extverCol != 0) {
          iVar1 = ffdcol(pfStack_18,extverCol,_extnameCol);
          *_extnameCol = iVar1;
          tform[5] = tform[5] + -1;
          if (extverCol < positionCol) {
            positionCol = positionCol + -1;
          }
          if (extverCol < locationCol) {
            locationCol = locationCol + -1;
          }
        }
        if (positionCol != 0) {
          iVar1 = ffdcol(pfStack_18,positionCol,_extnameCol);
          *_extnameCol = iVar1;
          tform[5] = tform[5] + -1;
          if (positionCol < locationCol) {
            locationCol = locationCol + -1;
          }
        }
        if (locationCol != 0) {
          iVar1 = ffdcol(pfStack_18,locationCol,_extnameCol);
          *_extnameCol = iVar1;
          tform[5] = tform[5] + -1;
        }
      }
      intNull._4_4_ = 0;
      while( true ) {
        bVar2 = false;
        if (intNull._4_4_ < nrows) {
          bVar2 = *_extnameCol == 0;
        }
        if (!bVar2) break;
        iVar1 = fficol(pfStack_18,(int)tform[5] + intNull._4_4_ + 1,ttype[(long)intNull._4_4_ + -1],
                       ttype[(long)intNull._4_4_ + 5],_extnameCol);
        *_extnameCol = iVar1;
        intNull._4_4_ = intNull._4_4_ + 1;
      }
      intNull._4_4_ = 0;
      while( true ) {
        bVar2 = false;
        if (intNull._4_4_ < nrows) {
          bVar2 = *_extnameCol == 0;
        }
        if (!bVar2) break;
        iVar1 = fits_strcasecmp(ttype[(long)intNull._4_4_ + -1],"MEMBER_POSITION");
        if ((iVar1 == 0) ||
           (iVar1 = fits_strcasecmp(ttype[(long)intNull._4_4_ + -1],"MEMBER_VERSION"), iVar1 == 0))
        {
          iVar1 = ffgcno(pfStack_18,1,ttype[(long)intNull._4_4_ + -1],&grptype,_extnameCol);
          *_extnameCol = iVar1;
          snprintf(local_1c8,0x4b,"TFORM%d",(ulong)(uint)grptype);
          iVar1 = ffgkys(pfStack_18,local_1c8,comment + 0x48,local_268,_extnameCol);
          *_extnameCol = iVar1;
          snprintf(local_1c8,0x4b,"TNULL%d",(ulong)(uint)grptype);
          iVar1 = ffikyj(pfStack_18,local_1c8,0,"Column Null Value",_extnameCol);
          *_extnameCol = iVar1;
          intNull._0_4_ = 1;
          while( true ) {
            bVar2 = false;
            if ((int)intNull <= i) {
              bVar2 = *_extnameCol == 0;
            }
            if (!bVar2) break;
            iVar1 = ffpclj(pfStack_18,grptype,(long)(int)intNull,1,1,&tfields,_extnameCol);
            *_extnameCol = iVar1;
            intNull._0_4_ = (int)intNull + 1;
          }
        }
        else {
          iVar1 = fits_strcasecmp(ttype[(long)intNull._4_4_ + -1],"MEMBER_XTENSION");
          if ((((iVar1 == 0) ||
               (iVar1 = fits_strcasecmp(ttype[(long)intNull._4_4_ + -1],"MEMBER_NAME"), iVar1 == 0))
              || (iVar1 = fits_strcasecmp(ttype[(long)intNull._4_4_ + -1],"MEMBER_URI_TYPE"),
                 iVar1 == 0)) ||
             (iVar1 = fits_strcasecmp(ttype[(long)intNull._4_4_ + -1],"MEMBER_LOCATION"), iVar1 == 0
             )) {
            iVar1 = ffgcno(pfStack_18,1,ttype[(long)intNull._4_4_ + -1],&grptype,_extnameCol);
            *_extnameCol = iVar1;
            intNull._0_4_ = 1;
            while( true ) {
              bVar2 = false;
              if ((int)intNull <= i) {
                bVar2 = *_extnameCol == 0;
              }
              if (!bVar2) break;
              iVar1 = ffpclb(pfStack_18,grptype,(long)(int)intNull,1,1,&local_c9,_extnameCol);
              *_extnameCol = iVar1;
              intNull._0_4_ = (int)intNull + 1;
            }
          }
        }
        intNull._4_4_ = intNull._4_4_ + 1;
      }
    }
    gfptr_local._4_4_ = *_extnameCol;
  }
  else {
    gfptr_local._4_4_ = *_extnameCol;
  }
  return gfptr_local._4_4_;
}

Assistant:

int ffgtch(fitsfile *gfptr,     /* FITS pointer to group                     */
	   int       grouptype, /* code specifying the type of
				   grouping table information:
				   GT_ID_ALL_URI  0 ==> defualt (all columns)
				   GT_ID_REF      1 ==> ID by reference
				   GT_ID_POS      2 ==> ID by position
				   GT_ID_ALL      3 ==> ID by ref. and position
				   GT_ID_REF_URI 11 ==> (1) + URI info 
				   GT_ID_POS_URI 12 ==> (2) + URI info       */
	   int      *status)     /* return status code                       */


/* 
   Change the grouping table structure of the grouping table pointed to by
   gfptr. The grouptype code specifies the new structure of the table. This
   operation only adds or removes grouping table columns, it does not add
   or delete group members (i.e., table rows). If the grouping table already
   has the desired structure then no operations are performed and function   
   simply returns with a (0) success status code. If the requested structure
   change creates new grouping table columns, then the column values for all
   existing members will be filled with the appropriate null values.
*/

{
  int xtensionCol, extnameCol, extverCol, positionCol, locationCol, uriCol;
  int ncols    = 0;
  int colnum   = 0;
  int nrows    = 0;
  int grptype  = 0;
  int i,j;

  long intNull  = 0;
  long tfields  = 0;
  
  char *tform[6];
  char *ttype[6];

  unsigned char  charNull[1] = {'\0'};

  char ttypeBuff[102];  
  char tformBuff[54];  

  char  keyword[FLEN_KEYWORD];
  char  keyvalue[FLEN_VALUE];
  char  comment[FLEN_COMMENT];


  if(*status != 0) return(*status);

  do
    {
      /* set up the ttype and tform character buffers */

      for(i = 0; i < 6; ++i)
	{
	  ttype[i] = ttypeBuff+(i*17);
	  tform[i] = tformBuff+(i*9);
	}

      /* retrieve positions of all Grouping table reserved columns */

      *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		       &locationCol,&uriCol,&grptype,status);

      if(*status != 0) continue;

      /* determine the total number of grouping table columns */

      *status = fits_read_key_lng(gfptr,"TFIELDS",&tfields,comment,status);

      /* define grouping table columns to be added to the configuration */

      *status = ffgtdc(grouptype,xtensionCol,extnameCol,extverCol,positionCol,
		       locationCol,uriCol,ttype,tform,&ncols,status);

      /*
	delete any grouping tables columns that exist but do not belong to
	new desired configuration; note that we delete before creating new
	columns for (file size) efficiency reasons
      */

      switch(grouptype)
	{

	case GT_ID_ALL_URI:

	  /* no columns to be deleted in this case */

	  break;

	case GT_ID_REF:

	  if(positionCol != 0) 
	    {
	      *status = fits_delete_col(gfptr,positionCol,status);
	      --tfields;
	      if(uriCol      > positionCol)  --uriCol;
	      if(locationCol > positionCol) --locationCol;
	    }
	  if(uriCol      != 0)
	    { 
	    *status = fits_delete_col(gfptr,uriCol,status);
	      --tfields;
	      if(locationCol > uriCol) --locationCol;
	    }
	  if(locationCol != 0) 
	    *status = fits_delete_col(gfptr,locationCol,status);

	  break;

	case  GT_ID_POS:

	  if(xtensionCol != 0) 
	    {
	      *status = fits_delete_col(gfptr,xtensionCol,status);
	      --tfields;
	      if(extnameCol  > xtensionCol)  --extnameCol;
	      if(extverCol   > xtensionCol)  --extverCol;
	      if(uriCol      > xtensionCol)  --uriCol;
	      if(locationCol > xtensionCol)  --locationCol;
	    }
	  if(extnameCol  != 0) 
	    {
	      *status = fits_delete_col(gfptr,extnameCol,status);
	      --tfields;
	      if(extverCol   > extnameCol)  --extverCol;
	      if(uriCol      > extnameCol)  --uriCol;
	      if(locationCol > extnameCol)  --locationCol;
	    }
	  if(extverCol   != 0)
	    { 
	      *status = fits_delete_col(gfptr,extverCol,status);
	      --tfields;
	      if(uriCol      > extverCol)  --uriCol;
	      if(locationCol > extverCol)  --locationCol;
	    }
	  if(uriCol      != 0)
	    { 
	      *status = fits_delete_col(gfptr,uriCol,status);
	      --tfields;
	      if(locationCol > uriCol)  --locationCol;
	    }
	  if(locationCol != 0)
	    { 
	      *status = fits_delete_col(gfptr,locationCol,status);
	      --tfields;
	    }
	  
	  break;

	case  GT_ID_ALL:

	  if(uriCol      != 0) 
	    {
	      *status = fits_delete_col(gfptr,uriCol,status);
	      --tfields;
	      if(locationCol > uriCol)  --locationCol;
	    }
	  if(locationCol != 0)
	    { 
	      *status = fits_delete_col(gfptr,locationCol,status);
	      --tfields;
	    }

	  break;

	case GT_ID_REF_URI:

	  if(positionCol != 0)
	    { 
	      *status = fits_delete_col(gfptr,positionCol,status);
	      --tfields;
	    }

	  break;

	case  GT_ID_POS_URI:

	  if(xtensionCol != 0) 
	    {
	      *status = fits_delete_col(gfptr,xtensionCol,status);
	      --tfields;
	      if(extnameCol > xtensionCol)  --extnameCol;
	      if(extverCol  > xtensionCol)  --extverCol;
	    }
	  if(extnameCol  != 0)
	    { 
	      *status = fits_delete_col(gfptr,extnameCol,status);
	      --tfields;
	      if(extverCol > extnameCol)  --extverCol;
	    }
	  if(extverCol   != 0)
	    { 
	      *status = fits_delete_col(gfptr,extverCol,status);
	      --tfields;
	    }

	  break;

	default:

	  *status = BAD_OPTION;
	  ffpmsg("Invalid value for grouptype parameter specified (ffgtch)");
	  break;

	}

      /*
	add all the new grouping table columns that were not there
	previously but are called for by the grouptype parameter
      */

      for(i = 0; i < ncols && *status == 0; ++i)
	*status = fits_insert_col(gfptr,tfields+i+1,ttype[i],tform[i],status);

      /* 
	 add the TNULL keywords and values for each new integer column defined;
	 integer null values are zero (0) for the MEMBER_POSITION and 
	 MEMBER_VERSION columns. Insert a null ("/0") into each new string
	 column defined: MEMBER_XTENSION, MEMBER_NAME, MEMBER_URI_TYPE and
	 MEMBER_LOCATION. Note that by convention a null string is the
	 TNULL value for character fields so no TNULL is required.
      */

      for(i = 0; i < ncols && *status == 0; ++i)
	{	  
	  if(fits_strcasecmp(ttype[i],"MEMBER_POSITION") == 0 ||
	     fits_strcasecmp(ttype[i],"MEMBER_VERSION")  == 0)
	    {
	      /* col contains int data; set TNULL and insert 0 for each col */

	      *status = fits_get_colnum(gfptr,CASESEN,ttype[i],&colnum,
					status);
	      
	      snprintf(keyword,FLEN_KEYWORD,"TFORM%d",colnum);

	      *status = fits_read_key_str(gfptr,keyword,keyvalue,comment,
					  status);
	 
	      snprintf(keyword,FLEN_KEYWORD,"TNULL%d",colnum);

	      *status = fits_insert_key_lng(gfptr,keyword,0,
					    "Column Null Value",status);

	      for(j = 1; j <= nrows && *status == 0; ++j)
		*status = fits_write_col_lng(gfptr,colnum,j,1,1,&intNull,
					     status);
	    }
	  else if(fits_strcasecmp(ttype[i],"MEMBER_XTENSION") == 0 ||
		  fits_strcasecmp(ttype[i],"MEMBER_NAME")     == 0 ||
		  fits_strcasecmp(ttype[i],"MEMBER_URI_TYPE") == 0 ||
		  fits_strcasecmp(ttype[i],"MEMBER_LOCATION") == 0)
	    {

	      /* new col contains character data; insert NULLs into each col */

	      *status = fits_get_colnum(gfptr,CASESEN,ttype[i],&colnum,
					status);

	      for(j = 1; j <= nrows && *status == 0; ++j)
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
		*status = fits_write_col_byt(gfptr,colnum,j,1,1,charNull,
					     status);
	    }
	}

    }while(0);

  return(*status);
}